

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O1

bool __thiscall
CFG::reachableProduction
          (CFG *this,Production **production,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *reachableSymbols)

{
  pointer pbVar1;
  pointer pcVar2;
  bool bVar3;
  pointer pbVar4;
  bool bVar5;
  string stateTo;
  long *local_90;
  long local_88;
  long local_80 [2];
  string local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  pbVar4 = ((*production)->toP).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = ((*production)->toP).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar5 = pbVar4 == pbVar1;
  if (!bVar5) {
    local_50 = reachableSymbols;
    do {
      local_90 = local_80;
      pcVar2 = (pbVar4->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar2,pcVar2 + pbVar4->_M_string_length);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,local_90,local_88 + (long)local_90);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_48,local_50);
      bVar3 = inVector(&local_70,&local_48);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if (local_90 != local_80) {
        operator_delete(local_90,local_80[0] + 1);
      }
      if (!bVar3) {
        return bVar5;
      }
      pbVar4 = pbVar4 + 1;
      bVar5 = pbVar4 == pbVar1;
    } while (!bVar5);
  }
  return bVar5;
}

Assistant:

bool CFG::reachableProduction(Production *&production, std::vector<std::string> reachableSymbols) {
    for (std::string stateTo: production->getToP()) {
        if (!inVector(stateTo, reachableSymbols)) {
            return false;
        }
    }
    return true;
}